

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

bitwidth_t __thiscall slang::SVInt::countXs(SVInt *this)

{
  uint64_t *puVar1;
  bitwidth_t bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  bVar2 = 0;
  if ((this->super_SVIntStorage).unknownFlag == true) {
    uVar3 = (ulong)((this->super_SVIntStorage).bitWidth + 0x3f >> 6);
    puVar1 = (this->super_SVIntStorage).field_0.pVal;
    bVar2 = 0;
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      uVar4 = ~puVar1[uVar5] & puVar1[uVar3 + uVar5];
      uVar4 = uVar4 - (uVar4 >> 1 & 0x5555555555555555);
      uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
      bVar2 = bVar2 + (byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
      ;
    }
  }
  return bVar2;
}

Assistant:

bitwidth_t SVInt::countXs() const {
    if (!unknownFlag)
        return 0;

    bitwidth_t count = 0;
    uint32_t words = getNumWords(bitWidth, false);
    for (uint32_t i = 0; i < words; i++)
        count += (bitwidth_t)std::popcount(~pVal[i] & pVal[i + words]);

    return count;
}